

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O0

void ftxui::anon_unknown_0::EventListener(atomic<bool> *quit,Sender<Event> *out)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  int local_d0;
  int i;
  int l;
  char buff [100];
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  local_58;
  undefined1 local_50 [8];
  TerminalInputParser parser;
  int buffer_size;
  Sender<Event> *out_local;
  atomic<bool> *quit_local;
  
  parser.pending_.field_2._12_4_ = 100;
  std::
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ::unique_ptr(&local_58,out);
  TerminalInputParser::TerminalInputParser((TerminalInputParser *)local_50,&local_58);
  std::
  unique_ptr<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
  ::~unique_ptr(&local_58);
  while (bVar1 = std::atomic::operator_cast_to_bool((atomic *)quit), ((bVar1 ^ 0xffU) & 1) != 0) {
    iVar2 = CheckStdinReady(20000);
    if (iVar2 == 0) {
      TerminalInputParser::Timeout((TerminalInputParser *)local_50,0x14);
    }
    else {
      iVar2 = fileno(_stdin);
      sVar3 = read(iVar2,&i,100);
      for (local_d0 = 0; local_d0 < (int)sVar3; local_d0 = local_d0 + 1) {
        TerminalInputParser::Add
                  ((TerminalInputParser *)local_50,*(char *)((long)&i + (long)local_d0));
      }
    }
  }
  TerminalInputParser::~TerminalInputParser((TerminalInputParser *)local_50);
  return;
}

Assistant:

void EventListener(std::atomic<bool>* quit, Sender<Event> out) {
  const int buffer_size = 100;

  auto parser = TerminalInputParser(std::move(out));

  while (!*quit) {
    if (!CheckStdinReady(timeout_microseconds)) {
      parser.Timeout(timeout_milliseconds);
      continue;
    }

    char buff[buffer_size];
    int l = read(fileno(stdin), buff, buffer_size);
    for (int i = 0; i < l; ++i)
      parser.Add(buff[i]);
  }
}